

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O2

int __thiscall Event::listen(Event *this,int __fd,int __n)

{
  long lVar1;
  undefined4 in_register_00000014;
  undefined8 *puVar2;
  undefined4 in_register_00000034;
  _Any_data local_78;
  long local_68;
  undefined8 local_60;
  Callable local_50;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000014,__n);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  local_60 = puVar2[3];
  lVar1 = puVar2[2];
  if (lVar1 != 0) {
    local_78._M_unused._0_8_ = (undefined8)*puVar2;
    local_78._8_8_ = puVar2[1];
    puVar2[2] = 0;
    puVar2[3] = 0;
    local_68 = lVar1;
  }
  Callable::Callable(&local_50,(function<void_(Peer_*)> *)&local_78);
  std::vector<Callable,_std::allocator<Callable>_>::emplace_back<Callable>
            (&((Event *)CONCAT44(in_register_00000034,__fd))->m_listeners,&local_50);
  Callable::~Callable(&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  Event(this,(Event *)CONCAT44(in_register_00000034,__fd));
  return (int)this;
}

Assistant:

Event Event::listen(std::function<void(Peer *)> func)
{
    m_listeners.emplace_back(Callable(std::move(func)));
    return *this;
}